

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

_Bool iter_advance_n_bytes(bfy_iter *iter,size_t n)

{
  ulong uVar1;
  _Bool _Var2;
  ulong uVar3;
  undefined1 auVar4 [16];
  
  do {
    uVar3 = n;
    uVar1 = (iter->io).iov_len;
    if (uVar3 <= uVar1) {
      (iter->io).iov_base = (void *)((long)(iter->io).iov_base + uVar3);
      (iter->io).iov_len = uVar1 - uVar3;
      auVar4._8_4_ = (int)uVar3;
      auVar4._0_8_ = uVar3;
      auVar4._12_4_ = (int)(uVar3 >> 0x20);
      (iter->cur).page_pos = uVar3 + (iter->cur).page_pos;
      (iter->cur).content_pos = auVar4._8_8_ + (iter->cur).content_pos;
      break;
    }
    _Var2 = iter_next_page(iter);
    n = uVar3 - uVar1;
  } while (_Var2);
  return uVar3 <= uVar1;
}

Assistant:

static bool
iter_advance_n_bytes(struct bfy_iter* const iter, size_t n) {
    while (iter->io.iov_len < n) { // make sure we're on the right page
        n -= iter->io.iov_len;
        if (!iter_next_page(iter)) {
            return false;
        }
    }
    iter->io = iov_drain(iter->io, n);
    iter->cur.page_pos += n;
    iter->cur.content_pos += n;
    return true;
}